

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::glTFImporter::CanRead(glTFImporter *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  bool bVar1;
  string version;
  Asset asset;
  string local_7d0;
  char *local_7b0;
  long local_7a8;
  undefined1 local_790 [1912];
  
  BaseImporter::GetExtension(&local_7d0,pFile);
  bVar1 = std::operator!=(&local_7d0,"gltf");
  if (bVar1) {
    bVar1 = std::operator!=(&local_7d0,"glb");
    if (pIOHandler != (IOSystem *)0x0 && !bVar1) {
LAB_0055714e:
      glTF::Asset::Asset((Asset *)local_790,pIOHandler);
      bVar1 = std::operator==(&local_7d0,"glb");
      glTF::Asset::Load((Asset *)local_790,pFile,bVar1);
      std::__cxx11::string::string((string *)&local_7b0,(string *)(local_790 + 0x128));
      if (local_7a8 == 0) {
        bVar1 = false;
      }
      else {
        bVar1 = *local_7b0 == '1';
      }
      std::__cxx11::string::~string((string *)&local_7b0);
      glTF::Asset::~Asset((Asset *)local_790);
      goto LAB_005571b9;
    }
  }
  else if (pIOHandler != (IOSystem *)0x0) goto LAB_0055714e;
  bVar1 = false;
LAB_005571b9:
  std::__cxx11::string::~string((string *)&local_7d0);
  return bVar1;
}

Assistant:

bool glTFImporter::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool /* checkSig */) const {
    const std::string &extension = GetExtension(pFile);

    if (extension != "gltf" && extension != "glb") {
        return false;
    }

    if (pIOHandler) {
        glTF::Asset asset(pIOHandler);
        try {
            asset.Load(pFile, extension == "glb");
            std::string version = asset.asset.version;
            return !version.empty() && version[0] == '1';
        } catch (...) {
            return false;
        }
    }

    return false;
}